

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O2

void HandleTargetOutcome(bool success)

{
  char *pcVar1;
  
  if (TargetOffloadPolicy == tgt_disabled) {
    if (!success) {
      return;
    }
    pcVar1 = "expected no offloading while offloading is disabled";
  }
  else if (TargetOffloadPolicy == tgt_mandatory) {
    if (success) {
      return;
    }
    pcVar1 = "failure of target construct while offloading is mandatory";
  }
  else {
    if (TargetOffloadPolicy != tgt_default) {
      return;
    }
    pcVar1 = "default offloading policy must switched to mandatory or disabled";
  }
  fprintf(_stderr,"Libomptarget fatal error %d: %s\n",1,pcVar1);
  exit(1);
}

Assistant:

static void HandleTargetOutcome(bool success) {
  switch (TargetOffloadPolicy) {
    case tgt_disabled:
      if (success) {
        FATAL_MESSAGE0(1, "expected no offloading while offloading is disabled");
      }
      break;
    case tgt_default:
        FATAL_MESSAGE0(1, "default offloading policy must switched to " 
            "mandatory or disabled");
      break;
    case tgt_mandatory:
      if (!success) {
        FATAL_MESSAGE0(1, "failure of target construct while offloading is mandatory");
      }
      break;
  }
}